

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void parsePath(xmllintState *lint,xmlChar *path)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  long lVar4;
  
  if (path != (xmlChar *)0x0) {
    xVar1 = *path;
    while (xVar1 != '\0') {
      if (0x3f < lint->nbpaths) {
        fwrite("MAX_PATHS reached: too many paths\n",0x22,1,(FILE *)lint->errStream);
        lint->progresult = XMLLINT_ERR_UNCLASS;
        return;
      }
      for (; (*path == ' ' || (*path == ':')); path = path + 1) {
      }
      lVar4 = 0;
      while ((0x3a < (ulong)path[lVar4] ||
             ((0x400000100000001U >> ((ulong)path[lVar4] & 0x3f) & 1) == 0))) {
        lVar4 = lVar4 + 1;
      }
      if (lVar4 != 0) {
        path = path + lVar4;
        pxVar3 = (xmlChar *)xmlStrndup();
        iVar2 = lint->nbpaths;
        lint->paths[iVar2] = pxVar3;
        if (pxVar3 != (xmlChar *)0x0) {
          lint->nbpaths = iVar2 + 1;
        }
      }
      xVar1 = *path;
    }
  }
  return;
}

Assistant:

static void
parsePath(xmllintState *lint, const xmlChar *path) {
    const xmlChar *cur;

    if (path == NULL)
	return;
    while (*path != 0) {
	if (lint->nbpaths >= MAX_PATHS) {
	    fprintf(lint->errStream, "MAX_PATHS reached: too many paths\n");
            lint->progresult = XMLLINT_ERR_UNCLASS;
	    return;
	}
	cur = path;
	while ((*cur == ' ') || (*cur == PATH_SEPARATOR))
	    cur++;
	path = cur;
	while ((*cur != 0) && (*cur != ' ') && (*cur != PATH_SEPARATOR))
	    cur++;
	if (cur != path) {
	    lint->paths[lint->nbpaths] = xmlStrndup(path, cur - path);
	    if (lint->paths[lint->nbpaths] != NULL)
		lint->nbpaths++;
	    path = cur;
	}
    }
}